

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_pa_buffer_attr *
ma_device__pa_buffer_attr_new
          (ma_pa_buffer_attr *__return_storage_ptr__,ma_uint32 periodSizeInFrames,ma_uint32 periods,
          ma_pa_sample_spec *ss)

{
  uint uVar1;
  long lVar2;
  
  if ((ulong)(uint)ss->format < 10) {
    lVar2 = *(long *)(&DAT_00115f20 + (ulong)(uint)ss->format * 8);
  }
  else {
    lVar2 = 0;
  }
  uVar1 = periodSizeInFrames * periods * (uint)ss->channels * (&DAT_001157a0)[lVar2];
  __return_storage_ptr__->maxlength = uVar1;
  uVar1 = uVar1 / periods;
  __return_storage_ptr__->tlength = uVar1;
  __return_storage_ptr__->prebuf = 0xffffffff;
  __return_storage_ptr__->minreq = 0xffffffff;
  __return_storage_ptr__->fragsize = uVar1;
  return __return_storage_ptr__;
}

Assistant:

static ma_pa_buffer_attr ma_device__pa_buffer_attr_new(ma_uint32 periodSizeInFrames, ma_uint32 periods, const ma_pa_sample_spec* ss)
{
    ma_pa_buffer_attr attr;
    attr.maxlength = periodSizeInFrames * periods * ma_get_bytes_per_frame(ma_format_from_pulse(ss->format), ss->channels);
    attr.tlength   = attr.maxlength / periods;
    attr.prebuf    = (ma_uint32)-1;
    attr.minreq    = (ma_uint32)-1;
    attr.fragsize  = attr.maxlength / periods;

    return attr;
}